

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry-inl.h
# Opt level: O1

void __thiscall
spdlog::details::registry::set_formatter
          (registry *this,
          unique_ptr<spdlog::formatter,_std::default_delete<spdlog::formatter>_> *formatter)

{
  formatter *pfVar1;
  formatter *pfVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  _Hash_node_base *p_Var5;
  int iVar6;
  pointer *__ptr;
  _Hash_node_base *p_Var7;
  _Hash_node_base *p_Var8;
  long *local_48;
  long *local_40;
  long *local_38;
  
  iVar6 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar6 != 0) {
    std::__throw_system_error(iVar6);
  }
  pfVar1 = (formatter->_M_t).
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (formatter->_M_t).
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = (formatter *)0x0;
  pfVar2 = (this->formatter_)._M_t.
           super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
           super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
           super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl;
  (this->formatter_)._M_t.
  super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
  super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
  super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl = pfVar1;
  if (pfVar2 != (formatter *)0x0) {
    (*pfVar2->_vptr_formatter[1])();
  }
  p_Var7 = (this->loggers_)._M_h._M_before_begin._M_nxt;
  if (p_Var7 != (_Hash_node_base *)0x0) {
    do {
      p_Var3 = p_Var7[5]._M_nxt;
      (*((this->formatter_)._M_t.
         super___uniq_ptr_impl<spdlog::formatter,_std::default_delete<spdlog::formatter>_>._M_t.
         super__Tuple_impl<0UL,_spdlog::formatter_*,_std::default_delete<spdlog::formatter>_>.
         super__Head_base<0UL,_spdlog::formatter_*,_false>._M_head_impl)->_vptr_formatter[3])
                (&local_48);
      p_Var8 = p_Var3[5]._M_nxt;
      while (p_Var4 = p_Var3[6]._M_nxt, p_Var8 != p_Var4) {
        p_Var5 = p_Var8->_M_nxt;
        p_Var8 = p_Var8 + 2;
        if (p_Var8 == p_Var4) {
          local_40 = local_48;
          local_48 = (long *)0x0;
          (*(code *)p_Var5->_M_nxt[5]._M_nxt)(p_Var5,&local_40);
          if (local_40 != (long *)0x0) {
            (**(code **)(*local_40 + 8))();
          }
          local_40 = (long *)0x0;
          break;
        }
        (**(code **)(*local_48 + 0x18))(&local_38);
        (*(code *)p_Var5->_M_nxt[5]._M_nxt)(p_Var5,&local_38);
        if (local_38 != (long *)0x0) {
          (**(code **)(*local_38 + 8))();
        }
        local_38 = (long *)0x0;
      }
      if (local_48 != (long *)0x0) {
        (**(code **)(*local_48 + 8))();
      }
      local_48 = (long *)0x0;
      p_Var7 = p_Var7->_M_nxt;
    } while (p_Var7 != (_Hash_node_base *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

SPDLOG_INLINE void registry::set_formatter(std::unique_ptr<formatter> formatter)
{
    std::lock_guard<std::mutex> lock(logger_map_mutex_);
    formatter_ = std::move(formatter);
    for (auto &l : loggers_)
    {
        l.second->set_formatter(formatter_->clone());
    }
}